

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int uv_tcp_getsockname(uv_tcp_t *handle,sockaddr *name,int *namelen)

{
  int *namelen_local;
  sockaddr *name_local;
  uv_tcp_t *handle_local;
  
  if (handle->delayed_error == 0) {
    handle_local._4_4_ = uv__getsockpeername((uv_handle_t *)handle,getsockname,name,namelen);
  }
  else {
    handle_local._4_4_ = handle->delayed_error;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_tcp_getsockname(const uv_tcp_t* handle,
                       struct sockaddr* name,
                       int* namelen) {

  if (handle->delayed_error)
    return handle->delayed_error;

  return uv__getsockpeername((const uv_handle_t*) handle,
                             getsockname,
                             name,
                             namelen);
}